

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O0

void __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
::render_section(basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *this,render_handler *handler,
                context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *ctx,component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                     *incomp,
                basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *var)

{
  bool bVar1;
  basic_list<std::__cxx11::basic_string<wchar_t>_> *this_00;
  walk_callback local_e8;
  walk_callback local_c8;
  context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_a8;
  context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ctxpusher_1;
  walk_callback local_90;
  context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_70;
  context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ctxpusher;
  basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *item;
  const_iterator __end0;
  const_iterator __begin0;
  basic_list<std::__cxx11::basic_string<wchar_t>_> *__range4;
  anon_class_24_3_6f1512f8 callback;
  basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *var_local;
  component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *incomp_local;
  context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *ctx_local;
  render_handler *handler_local;
  basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *this_local;
  
  __range4 = (basic_list<std::__cxx11::basic_string<wchar_t>_> *)handler;
  callback.handler = (render_handler *)ctx;
  callback.ctx = (context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  *)this;
  callback.this =
       (basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        *)var;
  if ((var == (basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)0x0) ||
     (bVar1 = basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              ::is_non_empty_list(var), !bVar1)) {
    if (callback.this ==
        (basic_mustache<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
         *)0x0) {
      (ctx->line_buffer).contained_section_tag = true;
      std::
      function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
      ::
      function<kainjow::mustache::basic_mustache<std::__cxx11::wstring>::render_section(std::function<void(std::__cxx11::wstring_const&)>const&,kainjow::mustache::context_internal<std::__cxx11::wstring>&,kainjow::mustache::component<std::__cxx11::wstring>&,kainjow::mustache::basic_data<std::__cxx11::wstring>const*)::_lambda(kainjow::mustache::component<std::__cxx11::wstring>&)_1_const&,void>
                ((function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
                  *)&local_e8,(anon_class_24_3_6f1512f8 *)&__range4);
      component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::walk_children(incomp,&local_e8);
      Catch::clara::std::
      function<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>
      ::~function(&local_e8);
      (ctx->line_buffer).contained_section_tag = true;
    }
    else {
      (ctx->line_buffer).contained_section_tag = true;
      context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::context_pusher(&local_a8,ctx,
                       (basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        *)callback.this);
      std::
      function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
      ::
      function<kainjow::mustache::basic_mustache<std::__cxx11::wstring>::render_section(std::function<void(std::__cxx11::wstring_const&)>const&,kainjow::mustache::context_internal<std::__cxx11::wstring>&,kainjow::mustache::component<std::__cxx11::wstring>&,kainjow::mustache::basic_data<std::__cxx11::wstring>const*)::_lambda(kainjow::mustache::component<std::__cxx11::wstring>&)_1_const&,void>
                ((function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
                  *)&local_c8,(anon_class_24_3_6f1512f8 *)&__range4);
      component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::walk_children(incomp,&local_c8);
      Catch::clara::std::
      function<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>
      ::~function(&local_c8);
      (ctx->line_buffer).contained_section_tag = true;
      context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::~context_pusher(&local_a8);
    }
  }
  else {
    this_00 = basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
              ::list_value((basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                            *)callback.this);
    __end0 = Catch::clara::std::
             vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
             ::begin(this_00);
    item = (basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            *)Catch::clara::std::
              vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
              ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
                                       *)&item), bVar1) {
      ctxpusher.ctx_ =
           (context_internal<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
            *)__gnu_cxx::
              __normal_iterator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
              ::operator*(&__end0);
      (ctx->line_buffer).contained_section_tag = true;
      context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::context_pusher(&local_70,ctx,
                       (basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        *)ctxpusher.ctx_);
      std::
      function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
      ::
      function<kainjow::mustache::basic_mustache<std::__cxx11::wstring>::render_section(std::function<void(std::__cxx11::wstring_const&)>const&,kainjow::mustache::context_internal<std::__cxx11::wstring>&,kainjow::mustache::component<std::__cxx11::wstring>&,kainjow::mustache::basic_data<std::__cxx11::wstring>const*)::_lambda(kainjow::mustache::component<std::__cxx11::wstring>&)_1_const&,void>
                ((function<kainjow::mustache::component<std::__cxx11::wstring>::walk_control(kainjow::mustache::component<std::__cxx11::wstring>&)>
                  *)&local_90,(anon_class_24_3_6f1512f8 *)&__range4);
      component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::walk_children(incomp,&local_90);
      Catch::clara::std::
      function<kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::walk_control_(kainjow::mustache::component<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_&)>
      ::~function(&local_90);
      (ctx->line_buffer).contained_section_tag = true;
      context_pusher<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::~context_pusher(&local_70);
      __gnu_cxx::
      __normal_iterator<const_kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_*,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>_>
      ::operator++(&__end0);
    }
  }
  return;
}

Assistant:

void render_section(const render_handler& handler, context_internal<string_type>& ctx, component<string_type>& incomp, const basic_data<string_type>* var) {
        const auto callback = [&handler, &ctx, this](component<string_type>& comp) -> typename component<string_type>::walk_control {
            return render_component(handler, ctx, comp);
        };
        if (var && var->is_non_empty_list()) {
            for (const auto& item : var->list_value()) {
                // account for the section begin tag
                ctx.line_buffer.contained_section_tag = true;

                const context_pusher<string_type> ctxpusher{ctx, &item};
                incomp.walk_children(callback);

                // ctx may have been cleared. account for the section end tag
                ctx.line_buffer.contained_section_tag = true;
            }
        } else if (var) {
            // account for the section begin tag
            ctx.line_buffer.contained_section_tag = true;

            const context_pusher<string_type> ctxpusher{ctx, var};
            incomp.walk_children(callback);

            // ctx may have been cleared. account for the section end tag
            ctx.line_buffer.contained_section_tag = true;
        } else {
            // account for the section begin tag
            ctx.line_buffer.contained_section_tag = true;

            incomp.walk_children(callback);

            // ctx may have been cleared. account for the section end tag
            ctx.line_buffer.contained_section_tag = true;
        }
    }